

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateClearingCode
          (StringFieldGenerator *this,Printer *printer)

{
  ulong uVar1;
  LogMessage *other;
  LogFinisher local_9a;
  byte local_99;
  LogMessage local_98;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  FieldDescriptor::default_value_string_abi_cxx11_((this->super_FieldGenerator).descriptor_);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_99 = 0;
    if ((this->inlined_ & 1U) != 0) {
      internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_string_field.cc"
                 ,0x16b);
      local_99 = 1;
      other = internal::LogMessage::operator<<(&local_98,"CHECK failed: !inlined_: ");
      internal::LogFinisher::operator=(&local_9a,other);
    }
    if ((local_99 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_98);
    }
    Formatter::operator()<>
              ((Formatter *)local_50,
               "$name$_.ClearToDefault($lazy_variable$, GetArenaForAllocation());\n");
  }
  else {
    Formatter::operator()<>((Formatter *)local_50,"$name$_.ClearToEmpty();\n");
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void StringFieldGenerator::GenerateClearingCode(io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (descriptor_->default_value_string().empty()) {
    format("$name$_.ClearToEmpty();\n");
  } else {
    GOOGLE_DCHECK(!inlined_);
    format(
        "$name$_.ClearToDefault($lazy_variable$, GetArenaForAllocation());\n");
  }
}